

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::z_formatter<spdlog::details::null_scoped_padder>::format
          (z_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  long lVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  char cVar5;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  ulong local_68 [3];
  buffer<char> local_50;
  memory_buf_t *local_30;
  
  lVar1 = (msg->time).__d.__r;
  if (9999999999 < lVar1 - (this->last_update_).__d.__r) {
    auVar3 = SEXT816(tm_time->tm_gmtoff) * ZEXT816(0x8888888888888889);
    this->offset_minutes_ = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
    (this->last_update_).__d.__r = lVar1;
  }
  uVar4 = this->offset_minutes_;
  if ((int)uVar4 < 0) {
    uVar4 = -uVar4;
    sVar2 = (dest->super_buffer<char>).size_;
    cVar5 = '-';
  }
  else {
    sVar2 = (dest->super_buffer<char>).size_;
    cVar5 = '+';
  }
  if ((dest->super_buffer<char>).capacity_ < sVar2 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = cVar5;
  if (uVar4 < 6000) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)((ulong)uVar4 / 600) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] =
         (char)(uVar4 / 0x3c) + (char)(((ulong)uVar4 / 0x3c) * 0x1999999a >> 0x20) * -10 | 0x30;
  }
  else {
    local_68[0] = (ulong)(uVar4 / 0x3c);
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001cd948;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_68;
    args.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt,args,(locale_ref)0x0);
  }
  uVar4 = uVar4 % 0x3c;
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ':';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = (byte)(uVar4 / 10) | 0x30;
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }